

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O2

int Abc_NtkTestTimNodeStrash(Gia_Man_t *pGia,Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pAVar1;
  Hop_Man_t *p;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar2;
  int iVar3;
  Hop_Obj_t *pHVar4;
  uint uVar5;
  long lVar6;
  char *__assertion;
  Hop_Obj_t *pObj;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
    pAVar1 = pNode->pNtk;
    if ((pAVar1->ntkFunc == ABC_FUNC_AIG) && (pAVar1->ntkType == ABC_NTK_LOGIC)) {
      p = (Hop_Man_t *)pAVar1->pManFunc;
      aVar2 = pNode->field_5;
      iVar3 = Abc_NodeIsConst(pNode);
      uVar5 = aVar2.iData;
      if ((iVar3 == 0) &&
         (pObj = (Hop_Obj_t *)((ulong)aVar2.pData & 0xfffffffffffffffe), p->pConst1 != pObj)) {
        for (lVar6 = 0; lVar6 < (pNode->vFanins).nSize; lVar6 = lVar6 + 1) {
          iVar3 = *(int *)((long)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar6]] + 0x40);
          pHVar4 = Hop_IthVar(p,(int)lVar6);
          (pHVar4->field_0).iData = iVar3;
        }
        Abc_NtkTestTimNodeStrash_rec(pGia,pObj);
        Hop_ConeUnmark_rec(pObj);
        iVar3 = Abc_LitNotCond((pObj->field_0).iData,uVar5 & 1);
        return iVar3;
      }
      return ~uVar5 & 1;
    }
    __assertion = "Abc_NtkIsAigLogic(pNode->pNtk)";
    uVar5 = 0x48;
  }
  else {
    __assertion = "Abc_ObjIsNode(pNode)";
    uVar5 = 0x47;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                ,uVar5,"int Abc_NtkTestTimNodeStrash(Gia_Man_t *, Abc_Obj_t *)");
}

Assistant:

int Abc_NtkTestTimNodeStrash( Gia_Man_t * pGia, Abc_Obj_t * pNode )
{
    Hop_Man_t * pMan;
    Hop_Obj_t * pRoot;
    Abc_Obj_t * pFanin;
    int i;
    assert( Abc_ObjIsNode(pNode) );
    assert( Abc_NtkIsAigLogic(pNode->pNtk) );
    // get the local AIG manager and the local root node
    pMan = (Hop_Man_t *)pNode->pNtk->pManFunc;
    pRoot = (Hop_Obj_t *)pNode->pData;
    // check the constant case
    if ( Abc_NodeIsConst(pNode) || Hop_Regular(pRoot) == Hop_ManConst1(pMan) )
        return !Hop_IsComplement(pRoot);
    // set elementary variables
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Hop_IthVar(pMan, i)->iData = pFanin->iTemp;
    // strash the AIG of this node
    Abc_NtkTestTimNodeStrash_rec( pGia, Hop_Regular(pRoot) );
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    // return the final node with complement if needed
    return Abc_LitNotCond( Hop_Regular(pRoot)->iData, Hop_IsComplement(pRoot) );
}